

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_udot_idx_h_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  int32_t iVar9;
  uintptr_t opr_sz_00;
  uintptr_t max_sz;
  uint64_t d1;
  uint64_t d0;
  uint16_t *m_indexed;
  uint16_t *n;
  uint64_t *d;
  intptr_t index;
  intptr_t opr_sz_8;
  intptr_t opr_sz;
  intptr_t i;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  iVar9 = simd_data(desc);
  for (opr_sz = 0; opr_sz < (long)opr_sz_00 / 8; opr_sz = opr_sz + 2) {
    uVar1 = *(ushort *)((long)vn + opr_sz * 8 + 8);
    uVar2 = *(ushort *)((long)vm + opr_sz * 8 + (long)iVar9 * 8);
    uVar3 = *(ushort *)((long)vn + opr_sz * 8 + 10);
    uVar4 = *(ushort *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 2);
    uVar5 = *(ushort *)((long)vn + opr_sz * 8 + 0xc);
    uVar6 = *(ushort *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 4);
    uVar7 = *(ushort *)((long)vn + opr_sz * 8 + 0xe);
    uVar8 = *(ushort *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 6);
    *(ulong *)((long)vd + opr_sz * 8) =
         (ulong)*(ushort *)((long)vn + opr_sz * 8 + 6) *
         (ulong)*(ushort *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 6) +
         (ulong)*(ushort *)((long)vn + opr_sz * 8 + 4) *
         (ulong)*(ushort *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 4) +
         (ulong)*(ushort *)((long)vn + opr_sz * 8 + 2) *
         (ulong)*(ushort *)((long)vm + opr_sz * 8 + (long)iVar9 * 8 + 2) +
         (ulong)*(ushort *)((long)vn + opr_sz * 8) *
         (ulong)*(ushort *)((long)vm + opr_sz * 8 + (long)iVar9 * 8) +
         *(long *)((long)vd + opr_sz * 8);
    *(ulong *)((long)vd + opr_sz * 8 + 8) =
         (ulong)uVar7 * (ulong)uVar8 +
         (ulong)uVar5 * (ulong)uVar6 + (ulong)uVar3 * (ulong)uVar4 + (ulong)uVar1 * (ulong)uVar2 +
         *(long *)((long)vd + opr_sz * 8 + 8);
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_udot_idx_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc), opr_sz_8 = opr_sz / 8;
    intptr_t index = simd_data(desc);
    uint64_t *d = vd;
    uint16_t *n = vn;
    uint16_t *m_indexed = (uint16_t *)vm + index * 4;

    /* This is supported by SVE only, so opr_sz is always a multiple of 16.
     * Process the entire segment all at once, writing back the results
     * only after we've consumed all of the inputs.
     */
    for (i = 0; i < opr_sz_8 ; i += 2) {
        uint64_t d0, d1;

        d0  = n[i * 4 + 0] * (uint64_t)m_indexed[i * 4 + 0];
        d0 += n[i * 4 + 1] * (uint64_t)m_indexed[i * 4 + 1];
        d0 += n[i * 4 + 2] * (uint64_t)m_indexed[i * 4 + 2];
        d0 += n[i * 4 + 3] * (uint64_t)m_indexed[i * 4 + 3];
        d1  = n[i * 4 + 4] * (uint64_t)m_indexed[i * 4 + 0];
        d1 += n[i * 4 + 5] * (uint64_t)m_indexed[i * 4 + 1];
        d1 += n[i * 4 + 6] * (uint64_t)m_indexed[i * 4 + 2];
        d1 += n[i * 4 + 7] * (uint64_t)m_indexed[i * 4 + 3];

        d[i + 0] += d0;
        d[i + 1] += d1;
    }

    clear_tail(d, opr_sz, simd_maxsz(desc));
}